

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_win_lock_(MPIABI_Fint *lock_type,MPIABI_Fint *rank,MPIABI_Fint *assert,MPIABI_Fint *win,
                     MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  MPIABI_Fint *win_local;
  MPIABI_Fint *assert_local;
  MPIABI_Fint *rank_local;
  MPIABI_Fint *lock_type_local;
  
  mpi_win_lock_(lock_type,rank,assert,win,ierror);
  return;
}

Assistant:

void mpiabi_win_lock_(
  const MPIABI_Fint * lock_type,
  const MPIABI_Fint * rank,
  const MPIABI_Fint * assert,
  const MPIABI_Fint * win,
  MPIABI_Fint * ierror
) {
  return mpi_win_lock_(
    lock_type,
    rank,
    assert,
    win,
    ierror
  );
}